

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O0

DSeqNode * SN_CheckSequence(sector_t *sector,int chan)

{
  bool bVar1;
  int iVar2;
  DSeqNode *pDVar3;
  undefined4 extraout_var;
  DSeqNode *next;
  DSeqNode *node;
  int chan_local;
  sector_t *sector_local;
  
  pDVar3 = DSeqNode::FirstSequence();
  while( true ) {
    do {
      next = pDVar3;
      if (next == (DSeqNode *)0x0) {
        return (DSeqNode *)0x0;
      }
      pDVar3 = DSeqNode::NextSequence(next);
      iVar2 = (*(next->super_DObject)._vptr_DObject[8])();
    } while ((sector_t *)CONCAT44(extraout_var,iVar2) != sector);
    bVar1 = DObject::IsKindOf(&next->super_DObject,DSeqSectorNode::RegistrationInfo.MyClass);
    if (!bVar1) break;
    if ((*(uint *)&next[1].super_DObject._vptr_DObject & 7) == chan) {
      return next;
    }
  }
  __assert_fail("node->IsKindOf(RUNTIME_CLASS(DSeqSectorNode))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sndseq.cpp"
                ,0x3e0,"DSeqNode *SN_CheckSequence(sector_t *, int)");
}

Assistant:

DSeqNode *SN_CheckSequence(sector_t *sector, int chan)
{
	for (DSeqNode *node = DSeqNode::FirstSequence(); node; )
	{
		DSeqNode *next = node->NextSequence();
		if (node->Source() == sector)
		{
			assert(node->IsKindOf(RUNTIME_CLASS(DSeqSectorNode)));
			if ((static_cast<DSeqSectorNode *>(node)->Channel & 7) == chan)
			{
				return node;
			}
		}
		node = next;
	}
	return NULL;
}